

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arf_freq_test.cc
# Opt level: O0

void __thiscall (anonymous_namespace)::ArfFreqTestLarge::PreEncodeFrameHook(ArfFreqTestLarge *this)

{
  Encoder *in_stack_00000010;
  VideoSource *in_stack_00000018;
  ArfFreqTestLarge *in_stack_00000020;
  
  anon_unknown.dwarf_dc822a::ArfFreqTestLarge::PreEncodeFrameHook
            (in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AV1E_SET_FRAME_PARALLEL_DECODING, 1);
      encoder->Control(AV1E_SET_TILE_COLUMNS, 4);
      encoder->Control(AOME_SET_CPUUSED, test_encode_param_.cpu_used);
      encoder->Control(AV1E_SET_MIN_GF_INTERVAL, min_arf_requested_);
      if (test_encode_param_.mode != ::libaom_test::kRealTime) {
        encoder->Control(AOME_SET_ENABLEAUTOALTREF, 1);
        encoder->Control(AOME_SET_ARNR_MAXFRAMES, 7);
        encoder->Control(AOME_SET_ARNR_STRENGTH, 5);
      }
    }
  }